

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix2 * matrix2_make_transformation_rotationf_z(matrix2 *m,double angle)

{
  double dVar1;
  double dVar2;
  
  dVar1 = cos(angle);
  dVar2 = sin(angle);
  (m->field_0).m[1] = 0.0;
  (m->field_0).m[2] = 0.0;
  (m->field_0).m[0] = dVar1;
  (m->field_0).m[1] = dVar2;
  (m->field_0).m[2] = -dVar2;
  (m->field_0).m[3] = dVar1;
  return m;
}

Assistant:

HYPAPI struct matrix2 *matrix2_make_transformation_rotationf_z(struct matrix2 *m, HYP_FLOAT angle)
{
	HYP_FLOAT c = HYP_COS(angle);
	HYP_FLOAT s = HYP_SIN(angle);

	matrix2_identity(m);

	m->r00 = c;
	m->r01 = s;
	m->r10 = -s;
	m->r11 = c;

	return m;
}